

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

bool Imath_3_2::anon_unknown_20::twoSidedJacobiRotation<float>
               (Matrix44<float> *A,int j,int k,Matrix44<float> *U,Matrix44<float> *V,float tol)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int l;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float p;
  float r;
  float fVar14;
  float fVar15;
  float fVar16;
  
  uVar9 = (ulong)(uint)j;
  fVar1 = A->x[j][uVar9];
  uVar10 = (ulong)(uint)k;
  fVar2 = A->x[j][uVar10];
  fVar3 = A->x[k][uVar9];
  fVar4 = A->x[k][uVar10];
  bVar5 = ABS(fVar1 + fVar4) * tol < ABS(fVar2 - fVar3);
  if (bVar5) {
    fVar12 = (fVar1 + fVar4) / (fVar2 - fVar3);
    fVar15 = 1.0 / SQRT(fVar12 * fVar12 + 1.0);
    fVar15 = (float)(-(uint)(fVar12 < 0.0) & (uint)-fVar15 | ~-(uint)(fVar12 < 0.0) & (uint)fVar15);
    fVar12 = fVar12 * fVar15;
    fVar13 = (fVar2 + fVar3) * fVar15 + (fVar4 - fVar1) * fVar12;
    fVar16 = fVar12 * fVar2 - fVar15 * fVar4;
    fVar16 = fVar16 + fVar16;
  }
  else {
    fVar13 = fVar4 - fVar1;
    fVar16 = fVar2 + fVar3;
    fVar12 = 1.0;
    fVar15 = 0.0;
  }
  bVar6 = ABS(fVar16) <= ABS(fVar13) * tol;
  if (bVar6) {
    fVar16 = 1.0;
    fVar13 = 0.0;
  }
  else {
    fVar13 = fVar13 / fVar16;
    fVar16 = 1.0 / (SQRT(fVar13 * fVar13 + 1.0) + ABS(fVar13));
    fVar13 = (float)(-(uint)(fVar13 < 0.0) & (uint)-fVar16 | ~-(uint)(fVar13 < 0.0) & (uint)fVar16);
    fVar16 = 1.0 / SQRT(fVar13 * fVar13 + 1.0);
    fVar13 = fVar13 * fVar16;
  }
  bVar6 = !bVar6;
  bVar7 = bVar6 || bVar5;
  if (bVar6 || bVar5) {
    fVar14 = fVar16 * fVar12 - fVar15 * fVar13;
    fVar15 = fVar12 * fVar13 + fVar15 * fVar16;
    A->x[j][uVar9] =
         (fVar1 * fVar16 - fVar13 * fVar2) * fVar14 - (fVar3 * fVar16 - fVar13 * fVar4) * fVar15;
    A->x[k][uVar10] =
         (fVar1 * fVar13 + fVar2 * fVar16) * fVar15 + (fVar3 * fVar13 + fVar4 * fVar16) * fVar14;
    uVar11 = 0;
    A->x[k][uVar9] = 0.0;
    A->x[j][uVar10] = 0.0;
    do {
      if (uVar10 != uVar11 && uVar9 != uVar11) {
        fVar1 = A->x[j][uVar11];
        fVar2 = A->x[k][uVar11];
        A->x[j][uVar11] = fVar14 * fVar1 + fVar2 * -fVar15;
        A->x[k][uVar11] = fVar1 * fVar15 + fVar2 * fVar14;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 4);
    lVar8 = 0;
    do {
      if (uVar10 << 4 != lVar8 && uVar9 << 4 != lVar8) {
        fVar1 = *(float *)((long)A->x[0] + lVar8 + uVar9 * 4);
        fVar2 = *(float *)((long)A->x[0] + lVar8 + uVar10 * 4);
        *(float *)((long)A->x[0] + lVar8 + uVar9 * 4) = fVar16 * fVar1 + fVar2 * -fVar13;
        *(float *)((long)A->x[0] + lVar8 + uVar10 * 4) = fVar1 * fVar13 + fVar2 * fVar16;
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    lVar8 = 0;
    do {
      fVar1 = *(float *)((long)U->x[0] + lVar8 + uVar9 * 4);
      fVar2 = *(float *)((long)U->x[0] + lVar8 + uVar10 * 4);
      *(float *)((long)U->x[0] + lVar8 + uVar9 * 4) = fVar14 * fVar1 - fVar15 * fVar2;
      *(float *)((long)U->x[0] + lVar8 + uVar10 * 4) = fVar1 * fVar15 + fVar2 * fVar14;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    lVar8 = 0;
    do {
      fVar1 = *(float *)((long)V->x[0] + lVar8 + uVar9 * 4);
      fVar2 = *(float *)((long)V->x[0] + lVar8 + uVar10 * 4);
      *(float *)((long)V->x[0] + lVar8 + uVar9 * 4) = fVar16 * fVar1 - fVar13 * fVar2;
      *(float *)((long)V->x[0] + lVar8 + uVar10 * 4) = fVar1 * fVar13 + fVar2 * fVar16;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    return bVar7;
  }
  A->x[k][uVar9] = 0.0;
  A->x[j][uVar10] = 0.0;
  return bVar7;
}

Assistant:

IMATH_HOSTDEVICE inline T*
Matrix44<T>::operator[] (int i) IMATH_NOEXCEPT
{
    return x[i];
}